

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

void __thiscall QMakeEvaluator::updateFeaturePaths(QMakeEvaluator *this)

{
  undefined1 *puVar1;
  QMakeGlobals *pQVar2;
  char cVar3;
  FileType FVar4;
  pointer pQVar5;
  QMakeFeatureRoots *ptr;
  short sVar6;
  QString *item;
  QArrayData *pQVar7;
  ProString *sfx;
  ProString *pPVar8;
  long lVar9;
  QString *root;
  QString *pQVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QDir specdir;
  ProKey local_190;
  QString local_160;
  QArrayDataPointer<QString> local_148;
  ProString local_128;
  QArrayDataPointer<QString> local_f8;
  QArrayDataPointer<QString> local_d8;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  QString *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar12.m_data = &DAT_00000008;
  QVar12.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar12);
  local_98._0_8_ = local_78._0_8_;
  local_98._8_8_ = local_78._8_8_;
  local_98._16_8_ = local_78._16_8_;
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar13.m_data = (storage_type *)0xa;
  QVar13.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar13);
  local_b8._0_8_ = local_78._0_8_;
  local_b8._8_8_ = local_78._8_8_;
  local_b8._16_8_ = local_78._16_8_;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (QString *)0x0;
  local_d8.size = 0;
  pQVar2 = this->m_option;
  QVar14.m_data = (storage_type *)0xd;
  QVar14.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar14);
  local_128.m_string.d.d = (Data *)local_78._0_8_;
  local_128.m_string.d.ptr = (char16_t *)local_78._8_8_;
  local_128.m_string.d.size = local_78._16_8_;
  QMakeGlobals::getPathListEnv((QStringList *)local_78,pQVar2,&local_128.m_string);
  QList<QString>::operator+=((QList<QString> *)&local_d8,(QList<QString> *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar10 = (this->m_qmakefeatures).d.ptr;
  QtPrivate::QCommonArrayOps<QString>::growAppend
            ((QCommonArrayOps<QString> *)&local_d8,pQVar10,pQVar10 + (this->m_qmakefeatures).d.size)
  ;
  pQVar2 = this->m_option;
  ProKey::ProKey((ProKey *)&local_128,"QMAKEFEATURES");
  QMakeProperty::value((ProString *)local_78,pQVar2->property,(ProKey *)&local_128);
  ProString::toQString((QString *)&local_f8,(ProString *)local_78);
  QMakeGlobals::splitPathList((QStringList *)&local_190,pQVar2,(QString *)&local_f8);
  QList<QString>::operator+=((QList<QString> *)&local_d8,(QList<QString> *)&local_190);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_190);
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (QString *)0x0;
  local_f8.size = 0;
  if ((this->m_buildRoot).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_98;
    local_128.m_string.d.d = (Data *)&this->m_buildRoot;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_f8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&this->m_buildRoot);
    QList<QString>::end((QList<QString> *)&local_f8);
  }
  if ((this->m_sourceRoot).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_98;
    local_128.m_string.d.d = (Data *)&this->m_sourceRoot;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_f8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&this->m_sourceRoot);
    QList<QString>::end((QList<QString> *)&local_f8);
  }
  local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_148.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = this->m_option;
  QVar15.m_data = (storage_type *)0x9;
  QVar15.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar15);
  local_128.m_string.d.d = (Data *)local_78._0_8_;
  local_128.m_string.d.ptr = (char16_t *)local_78._8_8_;
  local_128.m_string.d.size = local_78._16_8_;
  QMakeGlobals::getPathListEnv((QStringList *)&local_148,pQVar2,&local_128.m_string);
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_148.size != (undefined1 *)0x0) {
    lVar9 = local_148.size * 0x18;
    pQVar7 = (QArrayData *)local_148.ptr;
    do {
      local_128.m_string.d.d = (Data *)pQVar7;
      local_128.m_string.d.ptr = (char16_t *)local_98;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_128);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_f8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      pQVar7 = (QArrayData *)&pQVar7[1].alloc;
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  lVar9 = (this->m_qmakepath).d.size;
  if (lVar9 != 0) {
    pQVar7 = (QArrayData *)(this->m_qmakepath).d.ptr;
    lVar9 = lVar9 * 0x18;
    do {
      local_128.m_string.d.d = (Data *)pQVar7;
      local_128.m_string.d.ptr = (char16_t *)local_98;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_128);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_f8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      pQVar7 = (QArrayData *)&pQVar7[1].alloc;
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  if ((this->m_qmakespec).d.size != 0) {
    local_128.m_string.d.ptr = (char16_t *)local_b8;
    local_128.m_string.d.d = (Data *)&this->m_qmakespec;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_78,(QStringBuilder<QString_&,_QString_&> *)&local_128);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)local_78);
    QList<QString>::end((QList<QString> *)&local_d8);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    local_160.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_160,(QString *)&this->m_qmakespec);
    do {
      cVar3 = QDir::isRoot();
      if (cVar3 != '\0') break;
      cVar3 = QDir::cdUp();
      if (cVar3 == '\0') break;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDir::path();
      cVar3 = QString::endsWith((QString *)local_78,(CaseSensitivity)local_98);
      if (cVar3 != '\0') {
        local_190.super_ProString.m_string.d.ptr = (char16_t *)local_b8;
        local_190.super_ProString.m_string.d.d = (Data *)local_78;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  (&local_128.m_string,(QStringBuilder<const_QString_&,_QString_&> *)&local_190);
        FVar4 = QMakeInternal::IoUtils::fileType(&local_128.m_string);
        if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (FVar4 != FileNotFound) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)local_78);
          QList<QString>::end((QList<QString> *)&local_f8);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    } while (cVar3 == '\0');
    QDir::~QDir((QDir *)&local_160);
  }
  pQVar2 = this->m_option;
  ProKey::ProKey(&local_190,"QT_HOST_DATA/get");
  QMakeProperty::value(&local_128,pQVar2->property,&local_190);
  ProString::ProString((ProString *)local_78,&local_128);
  local_48 = (QString *)local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>
            (&local_160,(QStringBuilder<ProString,_QString_&> *)local_78);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&local_160);
  QList<QString>::end((QList<QString> *)&local_f8);
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = this->m_option;
  ProKey::ProKey(&local_190,"QT_HOST_DATA/src");
  QMakeProperty::value(&local_128,pQVar2->property,&local_190);
  ProString::ProString((ProString *)local_78,&local_128);
  local_48 = (QString *)local_98;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>
            (&local_160,(QStringBuilder<ProString,_QString_&> *)local_78);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,&local_160);
  QList<QString>::end((QList<QString> *)&local_f8);
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (&(local_128.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_f8.size != 0) {
    puVar1 = (undefined1 *)((long)local_f8.ptr + local_f8.size * 0x18);
    pQVar7 = (QArrayData *)local_f8.ptr;
    do {
      local_128.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_PLATFORM");
      values((ProStringList *)&local_128,this,(ProKey *)local_78);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_128.m_string.d.size != (ProString *)0x0) {
        lVar9 = local_128.m_string.d.size * 0x30;
        pPVar8 = (ProString *)local_128.m_string.d.ptr;
        do {
          local_78._8_8_ = local_b8;
          local_78[0x18] = '/';
          local_78._0_8_ = pQVar7;
          local_78._16_8_ = pPVar8;
          QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
          ::convertTo<QString>
                    ((QString *)&local_190,
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
                      *)local_78);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)&local_190);
          QList<QString>::end((QList<QString> *)&local_d8);
          if (&(local_190.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_190.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_190.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          pPVar8 = pPVar8 + 1;
          lVar9 = lVar9 + -0x30;
        } while (lVar9 != 0);
      }
      local_190.super_ProString.m_string.d.ptr = (char16_t *)local_b8;
      local_190.super_ProString.m_string.d.d = (Data *)pQVar7;
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_78,(QStringBuilder<const_QString_&,_QString_&> *)&local_190);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,(QString *)local_78);
      QList<QString>::end((QList<QString> *)&local_d8);
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_128);
      pQVar7 = (QArrayData *)&pQVar7[1].alloc;
    } while (pQVar7 != (QArrayData *)puVar1);
  }
  if (local_d8.size != 0) {
    sVar6 = 0;
    uVar11 = 0;
    do {
      cVar3 = QString::endsWith((QChar)((short)local_d8.ptr + sVar6),0x2f);
      if (cVar3 == '\0') {
        pQVar5 = QList<QString>::data((QList<QString> *)&local_d8);
        QString::append((QChar)((short)pQVar5 + sVar6));
      }
      uVar11 = uVar11 + 1;
      sVar6 = sVar6 + 0x18;
    } while (uVar11 < (ulong)local_d8.size);
  }
  QtPrivate::QStringList_removeDuplicates((QList *)&local_d8);
  local_78._0_8_ = (QString *)0x0;
  local_78._8_8_ = (QString *)0x0;
  local_78._16_8_ = (ProString *)0x0;
  if (local_d8.size != 0) {
    lVar9 = local_d8.size * 0x18;
    pQVar10 = local_d8.ptr;
    do {
      FVar4 = QMakeInternal::IoUtils::fileType(pQVar10);
      if (FVar4 != FileNotFound) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)local_78,local_78._16_8_,pQVar10);
        QList<QString>::end((QList<QString> *)local_78);
      }
      pQVar10 = pQVar10 + 1;
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  ptr = (QMakeFeatureRoots *)operator_new(0x28);
  (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (ptr->paths).d.d = (Data *)local_78._0_8_;
  (ptr->paths).d.ptr = (QString *)local_78._8_8_;
  (ptr->paths).d.size = local_78._16_8_;
  if ((QString *)local_78._0_8_ != (QString *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((DataPointer *)local_78._0_8_)->d)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&((DataPointer *)local_78._0_8_)->d)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (ptr->cache).d = (Data *)0x0;
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset(&this->m_featureRoots,ptr);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::updateFeaturePaths()
{
    QString mkspecs_concat = QLatin1String("/mkspecs");
    QString features_concat = QLatin1String("/features/");

    QStringList feature_roots;

    feature_roots += m_option->getPathListEnv(QLatin1String("QMAKEFEATURES"));
    feature_roots += m_qmakefeatures;
    feature_roots += m_option->splitPathList(
                m_option->propertyValue(ProKey("QMAKEFEATURES")).toQString());

    QStringList feature_bases;
    if (!m_buildRoot.isEmpty()) {
        feature_bases << m_buildRoot + mkspecs_concat;
        feature_bases << m_buildRoot;
    }
    if (!m_sourceRoot.isEmpty()) {
        feature_bases << m_sourceRoot + mkspecs_concat;
        feature_bases << m_sourceRoot;
    }

    const auto items = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &item : items)
        feature_bases << (item + mkspecs_concat);

    for (const QString &item : std::as_const(m_qmakepath))
        feature_bases << (item + mkspecs_concat);

    if (!m_qmakespec.isEmpty()) {
        // The spec is already platform-dependent, so no subdirs here.
        feature_roots << (m_qmakespec + features_concat);

        // Also check directly under the root directory of the mkspecs collection
        QDir specdir(m_qmakespec);
        while (!specdir.isRoot() && specdir.cdUp()) {
            const QString specpath = specdir.path();
            if (specpath.endsWith(mkspecs_concat)) {
                if (IoUtils::exists(specpath + features_concat))
                    feature_bases << specpath;
                break;
            }
        }
    }

    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + mkspecs_concat);
    feature_bases << (m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + mkspecs_concat);

    for (const QString &fb : std::as_const(feature_bases)) {
        const auto sfxs = values(ProKey("QMAKE_PLATFORM"));
        for (const ProString &sfx : sfxs)
            feature_roots << (fb + features_concat + sfx + QLatin1Char('/'));
        feature_roots << (fb + features_concat);
    }

    for (int i = 0; i < feature_roots.size(); ++i)
        if (!feature_roots.at(i).endsWith(QLatin1Char('/')))
            feature_roots[i].append(QLatin1Char('/'));

    feature_roots.removeDuplicates();

    QStringList ret;
    for (const QString &root : std::as_const(feature_roots))
        if (IoUtils::exists(root))
            ret << root;
    m_featureRoots = new QMakeFeatureRoots(ret);
}